

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-state.cpp
# Opt level: O3

void __thiscall mahjong::WiningState::WiningState(WiningState *this)

{
  _Rb_tree_header *p_Var1;
  
  this->is_win_by_discard = false;
  this->round_wind = EastWind;
  this->seat_wind = EastWind;
  p_Var1 = &(this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header;
  (this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->is_one_shot = false;
  this->is_last_discard = false;
  this->is_robbing_quad = false;
  this->is_last_tile_from_the_wall = false;
  this->is_dead_wall_draw = false;
  (this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bonus_tiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_uninterrupted_first_drawn = false;
  return;
}

Assistant:

WiningState::WiningState()
	: round_wind(Tile::EastWind)
	, seat_wind(Tile::EastWind)
{}